

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_rectfill_fp32x4(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  long lVar1;
  QRgbaFloat<float> value;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QRasterBuffer *in_RDI;
  int in_R8D;
  QRgbaFloat<float> *in_R9;
  long in_FS_OFFSET;
  ConvertAndStorePixelsFunc64 store;
  QRgbaFloat32 c;
  ConvertAndStorePixelsFunc64 p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = qStoreFromRGBA64PM[in_RDI->format];
  uVar4 = 0xffffffffffffffff;
  (*p_Var2)(&stack0xffffffffffffffe8,(QRgba64 *)in_R9,0,1,(QList<unsigned_int> *)0x0,
            (QDitherInfo *)0x0);
  QRasterBuffer::buffer(in_RDI);
  uVar3 = 0xffffffffffffffff;
  QRasterBuffer::bytesPerLine(in_RDI);
  value.b = (float)(int)uVar4;
  value.a = (float)(int)((ulong)uVar4 >> 0x20);
  value.r = (float)(int)uVar3;
  value.g = (float)(int)((ulong)uVar3 >> 0x20);
  qt_rectfill<QRgbaFloat<float>>
            (in_R9,value,(int)((ulong)p_Var2 >> 0x20),(int)p_Var2,in_R8D,in_ECX,
             CONCAT44(in_EDX,in_ESI));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_fp32x4(QRasterBuffer *rasterBuffer,
                               int x, int y, int width, int height,
                               const QRgba64 &color)
{
    const auto store = qStoreFromRGBA64PM[rasterBuffer->format];
    QRgbaFloat32 c;
    store(reinterpret_cast<uchar *>(&c), &color, 0, 1, nullptr, nullptr);
    qt_rectfill<QRgbaFloat32>(reinterpret_cast<QRgbaFloat32 *>(rasterBuffer->buffer()),
                          c, x, y, width, height, rasterBuffer->bytesPerLine());
}